

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_database_size.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::PragmaDatabaseSizeInit(ClientContext *context,TableFunctionInitInput *input)

{
  int iVar1;
  DatabaseManager *this;
  pointer pPVar2;
  BufferManager *pBVar3;
  undefined4 extraout_var;
  StringUtil *this_00;
  idx_t in_RCX;
  _Head_base<0UL,_duckdb::PragmaDatabaseSizeData_*,_false> local_a0;
  Value local_98;
  string local_58;
  string local_38;
  undefined4 extraout_var_00;
  
  make_uniq<duckdb::PragmaDatabaseSizeData>();
  this = DatabaseManager::Get((ClientContext *)input);
  DatabaseManager::GetDatabases
            ((vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true> *)&local_98,this,
             (ClientContext *)input);
  pPVar2 = unique_ptr<duckdb::PragmaDatabaseSizeData,_std::default_delete<duckdb::PragmaDatabaseSizeData>,_true>
           ::operator->((unique_ptr<duckdb::PragmaDatabaseSizeData,_std::default_delete<duckdb::PragmaDatabaseSizeData>,_true>
                         *)&local_a0);
  ::std::
  vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  ::_M_move_assign(&(pPVar2->databases).
                    super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
                   ,&local_98);
  ::std::
  _Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
                   *)&local_98);
  pBVar3 = BufferManager::GetBufferManager((ClientContext *)input);
  iVar1 = (*pBVar3->_vptr_BufferManager[10])(pBVar3);
  StringUtil::BytesToHumanReadableString_abi_cxx11_
            (&local_38,(StringUtil *)CONCAT44(extraout_var,iVar1),0x400,in_RCX);
  Value::Value(&local_98,&local_38);
  pPVar2 = unique_ptr<duckdb::PragmaDatabaseSizeData,_std::default_delete<duckdb::PragmaDatabaseSizeData>,_true>
           ::operator->((unique_ptr<duckdb::PragmaDatabaseSizeData,_std::default_delete<duckdb::PragmaDatabaseSizeData>,_true>
                         *)&local_a0);
  Value::operator=(&pPVar2->memory_usage,&local_98);
  Value::~Value(&local_98);
  ::std::__cxx11::string::~string((string *)&local_38);
  iVar1 = (*pBVar3->_vptr_BufferManager[0xb])(pBVar3);
  this_00 = (StringUtil *)CONCAT44(extraout_var_00,iVar1);
  if (this_00 == (StringUtil *)0xffffffffffffffff) {
    Value::Value(&local_98,"Unlimited");
  }
  else {
    StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_58,this_00,0x400,in_RCX);
    Value::Value(&local_98,&local_58);
  }
  pPVar2 = unique_ptr<duckdb::PragmaDatabaseSizeData,_std::default_delete<duckdb::PragmaDatabaseSizeData>,_true>
           ::operator->((unique_ptr<duckdb::PragmaDatabaseSizeData,_std::default_delete<duckdb::PragmaDatabaseSizeData>,_true>
                         *)&local_a0);
  Value::operator=(&pPVar2->memory_limit,&local_98);
  Value::~Value(&local_98);
  if (this_00 != (StringUtil *)0xffffffffffffffff) {
    ::std::__cxx11::string::~string((string *)&local_58);
  }
  (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_a0._M_head_impl;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )context;
}

Assistant:

unique_ptr<GlobalTableFunctionState> PragmaDatabaseSizeInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<PragmaDatabaseSizeData>();
	result->databases = DatabaseManager::Get(context).GetDatabases(context);
	auto &buffer_manager = BufferManager::GetBufferManager(context);
	result->memory_usage = Value(StringUtil::BytesToHumanReadableString(buffer_manager.GetUsedMemory()));
	auto max_memory = buffer_manager.GetMaxMemory();
	result->memory_limit =
	    max_memory == (idx_t)-1 ? Value("Unlimited") : Value(StringUtil::BytesToHumanReadableString(max_memory));

	return std::move(result);
}